

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,true,false>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lentry;
  ulong uVar7;
  idx_t iVar8;
  long lentry_1;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  interval_t iVar12;
  interval_t left;
  interval_t left_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar2 = *ldata;
      lVar6 = 8;
      iVar8 = count;
      do {
        iVar12.micros = lVar2;
        iVar12._0_8_ = *(undefined8 *)((long)&rdata->months + lVar6);
        iVar12 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                           (*(MultiplyOperator **)((long)rdata + lVar6 + -8),iVar12,count);
        *(long *)((long)result_data + lVar6 + -8) = iVar12._0_8_;
        *(int64_t *)((long)&result_data->months + lVar6) = iVar12.micros;
        lVar6 = lVar6 + 0x10;
        iVar8 = iVar8 - 1;
      } while (iVar8 != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar3 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar1[uVar4];
      }
      uVar5 = uVar3 + 0x40;
      if (count <= uVar3 + 0x40) {
        uVar5 = count;
      }
      uVar11 = uVar5;
      if (uVar9 != 0) {
        uVar11 = uVar3;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar3 < uVar5) {
            lVar2 = *ldata;
            uVar10 = uVar3 << 4 | 8;
            uVar3 = uVar4;
            do {
              left.micros = lVar2;
              left._0_8_ = *(undefined8 *)((long)&rdata->months + uVar10);
              iVar12 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                 (*(MultiplyOperator **)((long)rdata + (uVar10 - 8)),left,uVar3);
              *(long *)((long)result_data + (uVar10 - 8)) = iVar12._0_8_;
              *(int64_t *)((long)&result_data->months + uVar10) = iVar12.micros;
              uVar11 = uVar11 + 1;
              uVar10 = uVar10 + 0x10;
            } while (uVar5 != uVar11);
          }
        }
        else if (uVar3 < uVar5) {
          uVar10 = uVar3 << 4 | 8;
          uVar7 = 0;
          uVar11 = uVar4;
          do {
            if ((uVar9 >> (uVar7 & 0x3f) & 1) != 0) {
              left_00.micros = *ldata;
              left_00._0_8_ = *(undefined8 *)((long)&rdata->months + uVar10);
              iVar12 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                 (*(MultiplyOperator **)((long)rdata + (uVar10 - 8)),left_00,uVar11)
              ;
              *(long *)((long)result_data + (uVar10 - 8)) = iVar12._0_8_;
              *(int64_t *)((long)&result_data->months + uVar10) = iVar12.micros;
            }
            uVar7 = uVar7 + 1;
            uVar10 = uVar10 + 0x10;
          } while ((uVar3 - uVar5) + uVar7 != 0);
          uVar11 = uVar3 + uVar7;
        }
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar11;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}